

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void iadst16_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  __m256i in0;
  __m256i in1;
  longlong local_1a0;
  longlong lStack_198;
  longlong lStack_190;
  longlong lStack_188;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar11 = (long)bit * 0x100;
  iVar13 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x168);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16._16_4_ = uVar1;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = uVar1;
  auVar16._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 600);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x188);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x238);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1a8);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x218);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1c8);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1f8);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1e8);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d8);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x208);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1b8);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x228);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x198);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37._16_4_ = uVar1;
  auVar37._20_4_ = uVar1;
  auVar37._24_4_ = uVar1;
  auVar37._28_4_ = uVar1;
  auVar18 = vpmulld_avx2((undefined1  [32])*in,auVar18);
  auVar16 = vpmulld_avx2((undefined1  [32])*in,auVar16);
  auVar26 = vpmulld_avx2((undefined1  [32])in[2],auVar26);
  auVar21 = vpmulld_avx2((undefined1  [32])in[2],auVar21);
  auVar24 = vpmulld_avx2((undefined1  [32])in[4],auVar24);
  auVar45 = vpmulld_avx2((undefined1  [32])in[4],auVar45);
  auVar30 = vpmulld_avx2((undefined1  [32])in[6],auVar30);
  auVar34 = vpmulld_avx2((undefined1  [32])in[6],auVar34);
  auVar43 = vpmulld_avx2((undefined1  [32])in[7],auVar43);
  auVar42 = vpmulld_avx2((undefined1  [32])in[7],auVar42);
  auVar40 = vpmulld_avx2((undefined1  [32])in[5],auVar40);
  auVar39 = vpmulld_avx2((undefined1  [32])in[5],auVar39);
  auVar36 = vpmulld_avx2((undefined1  [32])in[3],auVar36);
  auVar37 = vpmulld_avx2((undefined1  [32])in[3],auVar37);
  auVar25._4_4_ = iVar13;
  auVar25._0_4_ = iVar13;
  auVar25._8_4_ = iVar13;
  auVar25._12_4_ = iVar13;
  auVar25._16_4_ = iVar13;
  auVar25._20_4_ = iVar13;
  auVar25._24_4_ = iVar13;
  auVar25._28_4_ = iVar13;
  auVar18 = vpaddd_avx2(auVar18,auVar25);
  auVar28 = vpsrad_avx2(auVar18,ZEXT416((uint)bit));
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x248);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar31._16_4_ = uVar1;
  auVar31._20_4_ = uVar1;
  auVar31._24_4_ = uVar1;
  auVar31._28_4_ = uVar1;
  auVar31 = vpmulld_avx2((undefined1  [32])in[1],auVar31);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x178);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32._16_4_ = uVar1;
  auVar32._20_4_ = uVar1;
  auVar32._24_4_ = uVar1;
  auVar32._28_4_ = uVar1;
  auVar32 = vpmulld_avx2((undefined1  [32])in[1],auVar32);
  auVar18 = vpsubd_avx2(auVar25,auVar16);
  auVar19 = vpsrad_avx2(auVar18,ZEXT416((uint)bit));
  auVar18 = vpaddd_avx2(auVar43,auVar25);
  auVar29 = ZEXT416((uint)bit);
  auVar16 = vpsrad_avx2(auVar18,auVar29);
  auVar18 = vpaddd_avx2(auVar16,auVar28);
  auVar28 = vpsubd_avx2(auVar28,auVar16);
  auVar16 = vpaddd_avx2(auVar26,auVar25);
  auVar43 = vpsrad_avx2(auVar16,auVar29);
  auVar16 = vpaddd_avx2(auVar42,auVar25);
  auVar26 = vpsrad_avx2(auVar16,auVar29);
  auVar16 = vpaddd_avx2(auVar26,auVar19);
  auVar19 = vpsubd_avx2(auVar19,auVar26);
  auVar26 = vpsubd_avx2(auVar25,auVar21);
  auVar42 = vpsrad_avx2(auVar26,auVar29);
  auVar26 = vpaddd_avx2(auVar40,auVar25);
  auVar29 = ZEXT416((uint)bit);
  auVar21 = vpsrad_avx2(auVar26,auVar29);
  auVar26 = vpaddd_avx2(auVar21,auVar43);
  auVar40 = vpsubd_avx2(auVar43,auVar21);
  auVar21 = vpaddd_avx2(auVar25,auVar24);
  auVar43 = vpsrad_avx2(auVar21,auVar29);
  auVar21 = vpaddd_avx2(auVar39,auVar25);
  auVar24 = vpsrad_avx2(auVar21,auVar29);
  auVar21 = vpaddd_avx2(auVar24,auVar42);
  auVar39 = vpsubd_avx2(auVar42,auVar24);
  auVar24 = vpsubd_avx2(auVar25,auVar45);
  auVar42 = vpsrad_avx2(auVar24,auVar29);
  auVar24 = vpaddd_avx2(auVar36,auVar25);
  auVar45 = vpsrad_avx2(auVar24,auVar29);
  auVar24 = vpaddd_avx2(auVar45,auVar43);
  auVar36 = vpsubd_avx2(auVar43,auVar45);
  auVar45 = vpaddd_avx2(auVar25,auVar30);
  auVar43 = vpsrad_avx2(auVar45,auVar29);
  auVar45 = vpaddd_avx2(auVar37,auVar25);
  auVar30 = vpsrad_avx2(auVar45,auVar29);
  auVar45 = vpaddd_avx2(auVar30,auVar42);
  auVar37 = vpsubd_avx2(auVar42,auVar30);
  auVar30 = vpsubd_avx2(auVar25,auVar34);
  auVar42 = vpsrad_avx2(auVar30,auVar29);
  auVar30 = vpaddd_avx2(auVar31,auVar25);
  auVar29 = ZEXT416((uint)bit);
  auVar34 = vpsrad_avx2(auVar30,auVar29);
  auVar30 = vpaddd_avx2(auVar34,auVar43);
  auVar31 = vpsubd_avx2(auVar43,auVar34);
  auVar34 = vpaddd_avx2(auVar32,auVar25);
  auVar43 = vpsrad_avx2(auVar34,auVar29);
  auVar34 = vpaddd_avx2(auVar43,auVar42);
  auVar43 = vpsubd_avx2(auVar42,auVar43);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  iVar15 = -iVar13;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  iVar14 = -iVar2;
  iVar12 = -iVar3;
  iVar9 = bd + (uint)(do_cols == 0) * 2;
  iVar10 = 0x8000;
  if (0xf < iVar9 + 6) {
    iVar10 = 1 << ((char)iVar9 + 5U & 0x1f);
  }
  iVar9 = -iVar10;
  iVar10 = iVar10 + -1;
  auVar44._4_4_ = iVar13;
  auVar44._0_4_ = iVar13;
  auVar44._8_4_ = iVar13;
  auVar44._12_4_ = iVar13;
  auVar44._16_4_ = iVar13;
  auVar44._20_4_ = iVar13;
  auVar44._24_4_ = iVar13;
  auVar44._28_4_ = iVar13;
  auVar17._4_4_ = iVar9;
  auVar17._0_4_ = iVar9;
  auVar17._8_4_ = iVar9;
  auVar17._12_4_ = iVar9;
  auVar17._16_4_ = iVar9;
  auVar17._20_4_ = iVar9;
  auVar17._24_4_ = iVar9;
  auVar17._28_4_ = iVar9;
  auVar27._4_4_ = iVar10;
  auVar27._0_4_ = iVar10;
  auVar27._8_4_ = iVar10;
  auVar27._12_4_ = iVar10;
  auVar27._16_4_ = iVar10;
  auVar27._20_4_ = iVar10;
  auVar27._24_4_ = iVar10;
  auVar27._28_4_ = iVar10;
  auVar42 = vpmaxsd_avx2(auVar28,auVar17);
  auVar32 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar19,auVar17);
  auVar28 = vpminsd_avx2(auVar42,auVar27);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  auVar19 = vpmulld_avx2(auVar32,auVar44);
  auVar44 = vpmulld_avx2(auVar28,auVar44);
  auVar42 = vpmulld_avx2(auVar32,auVar38);
  auVar42 = vpaddd_avx2(auVar42,auVar25);
  auVar42 = vpaddd_avx2(auVar42,auVar44);
  auVar28 = vpmulld_avx2(auVar38,auVar28);
  auVar32 = vpaddd_avx2(auVar19,auVar25);
  auVar44 = vpsubd_avx2(auVar32,auVar28);
  auVar19._4_4_ = iVar2;
  auVar19._0_4_ = iVar2;
  auVar19._8_4_ = iVar2;
  auVar19._12_4_ = iVar2;
  auVar19._16_4_ = iVar2;
  auVar19._20_4_ = iVar2;
  auVar19._24_4_ = iVar2;
  auVar19._28_4_ = iVar2;
  auVar40 = vpmaxsd_avx2(auVar40,auVar17);
  auVar32 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar39,auVar17);
  auVar39 = vpminsd_avx2(auVar40,auVar27);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  auVar28 = vpmulld_avx2(auVar39,auVar19);
  auVar19 = vpmulld_avx2(auVar32,auVar19);
  auVar40 = vpmulld_avx2(auVar32,auVar35);
  auVar40 = vpaddd_avx2(auVar40,auVar25);
  auVar40 = vpaddd_avx2(auVar28,auVar40);
  auVar32 = vpmulld_avx2(auVar35,auVar39);
  auVar39 = vpaddd_avx2(auVar19,auVar25);
  auVar19 = vpsubd_avx2(auVar39,auVar32);
  auVar22._4_4_ = iVar15;
  auVar22._0_4_ = iVar15;
  auVar22._8_4_ = iVar15;
  auVar22._12_4_ = iVar15;
  auVar22._16_4_ = iVar15;
  auVar22._20_4_ = iVar15;
  auVar22._24_4_ = iVar15;
  auVar22._28_4_ = iVar15;
  auVar39 = vpmaxsd_avx2(auVar17,auVar36);
  auVar36 = vpminsd_avx2(auVar39,auVar27);
  auVar39 = vpmaxsd_avx2(auVar37,auVar17);
  auVar37 = vpminsd_avx2(auVar39,auVar27);
  auVar32 = vpmulld_avx2(auVar37,auVar38);
  auVar28 = vpmulld_avx2(auVar36,auVar38);
  auVar39 = vpmulld_avx2(auVar36,auVar22);
  auVar39 = vpaddd_avx2(auVar39,auVar25);
  auVar39 = vpaddd_avx2(auVar39,auVar32);
  auVar37 = vpmulld_avx2(auVar22,auVar37);
  auVar36 = vpaddd_avx2(auVar28,auVar25);
  auVar28 = vpsubd_avx2(auVar36,auVar37);
  auVar33._4_4_ = iVar14;
  auVar33._0_4_ = iVar14;
  auVar33._8_4_ = iVar14;
  auVar33._12_4_ = iVar14;
  auVar33._16_4_ = iVar14;
  auVar33._20_4_ = iVar14;
  auVar33._24_4_ = iVar14;
  auVar33._28_4_ = iVar14;
  auVar36 = vpmaxsd_avx2(auVar31,auVar17);
  auVar36 = vpminsd_avx2(auVar36,auVar27);
  auVar43 = vpmaxsd_avx2(auVar43,auVar17);
  auVar37 = vpminsd_avx2(auVar43,auVar27);
  auVar31 = vpmulld_avx2(auVar37,auVar35);
  auVar32 = vpmulld_avx2(auVar36,auVar35);
  auVar43 = vpmulld_avx2(auVar36,auVar33);
  auVar43 = vpaddd_avx2(auVar43,auVar25);
  auVar43 = vpaddd_avx2(auVar31,auVar43);
  auVar37 = vpmulld_avx2(auVar33,auVar37);
  auVar36 = vpaddd_avx2(auVar32,auVar25);
  auVar37 = vpsubd_avx2(auVar36,auVar37);
  auVar18 = vpmaxsd_avx2(auVar17,auVar18);
  auVar36 = vpminsd_avx2(auVar18,auVar27);
  auVar18 = vpmaxsd_avx2(auVar17,auVar24);
  auVar24 = vpminsd_avx2(auVar18,auVar27);
  auVar18 = vpaddd_avx2(auVar24,auVar36);
  auVar31 = vpsubd_avx2(auVar36,auVar24);
  auVar16 = vpmaxsd_avx2(auVar17,auVar16);
  auVar24 = vpminsd_avx2(auVar16,auVar27);
  auVar16 = vpmaxsd_avx2(auVar17,auVar45);
  auVar45 = vpminsd_avx2(auVar16,auVar27);
  auVar16 = vpaddd_avx2(auVar45,auVar24);
  auVar32 = vpsubd_avx2(auVar24,auVar45);
  auVar26 = vpmaxsd_avx2(auVar17,auVar26);
  auVar24 = vpminsd_avx2(auVar26,auVar27);
  auVar26 = vpmaxsd_avx2(auVar17,auVar30);
  auVar45 = vpminsd_avx2(auVar26,auVar27);
  auVar26 = vpaddd_avx2(auVar45,auVar24);
  auVar22 = vpsubd_avx2(auVar24,auVar45);
  auVar21 = vpmaxsd_avx2(auVar17,auVar21);
  auVar24 = vpminsd_avx2(auVar21,auVar27);
  auVar21 = vpmaxsd_avx2(auVar17,auVar34);
  auVar30 = vpsrad_avx2(auVar42,auVar29);
  auVar34 = vpsrad_avx2(auVar44,auVar29);
  auVar42 = vpsrad_avx2(auVar40,auVar29);
  auVar40 = vpsrad_avx2(auVar19,auVar29);
  auVar45 = vpminsd_avx2(auVar21,auVar27);
  auVar39 = vpsrad_avx2(auVar39,auVar29);
  auVar21 = vpaddd_avx2(auVar45,auVar24);
  auVar19 = vpsubd_avx2(auVar24,auVar45);
  auVar36 = vpsrad_avx2(auVar28,auVar29);
  auVar24 = vpaddd_avx2(auVar39,auVar30);
  auVar28 = vpsubd_avx2(auVar30,auVar39);
  auVar43 = vpsrad_avx2(auVar43,auVar29);
  auVar45 = vpaddd_avx2(auVar36,auVar34);
  auVar44 = vpsubd_avx2(auVar34,auVar36);
  auVar39 = vpsrad_avx2(auVar37,auVar29);
  auVar30 = vpaddd_avx2(auVar42,auVar43);
  auVar33 = vpsubd_avx2(auVar42,auVar43);
  auVar34 = vpaddd_avx2(auVar40,auVar39);
  auVar35 = vpsubd_avx2(auVar40,auVar39);
  auVar41._4_4_ = iVar3;
  auVar41._0_4_ = iVar3;
  auVar41._8_4_ = iVar3;
  auVar41._12_4_ = iVar3;
  auVar41._16_4_ = iVar3;
  auVar41._20_4_ = iVar3;
  auVar41._24_4_ = iVar3;
  auVar41._28_4_ = iVar3;
  auVar43 = vpmaxsd_avx2(auVar17,auVar31);
  auVar42 = vpminsd_avx2(auVar43,auVar27);
  auVar43 = vpmaxsd_avx2(auVar32,auVar17);
  auVar40 = vpminsd_avx2(auVar43,auVar27);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  auVar43 = vpmulld_avx2(auVar42,auVar20);
  auVar43 = vpaddd_avx2(auVar43,auVar25);
  auVar39 = vpmulld_avx2(auVar40,auVar41);
  auVar43 = vpaddd_avx2(auVar43,auVar39);
  auVar42 = vpmulld_avx2(auVar42,auVar41);
  auVar40 = vpmulld_avx2(auVar20,auVar40);
  auVar42 = vpaddd_avx2(auVar42,auVar25);
  auVar38 = vpsubd_avx2(auVar42,auVar40);
  auVar23._4_4_ = iVar12;
  auVar23._0_4_ = iVar12;
  auVar23._8_4_ = iVar12;
  auVar23._12_4_ = iVar12;
  auVar23._16_4_ = iVar12;
  auVar23._20_4_ = iVar12;
  auVar23._24_4_ = iVar12;
  auVar23._28_4_ = iVar12;
  auVar42 = vpmaxsd_avx2(auVar17,auVar22);
  auVar40 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmaxsd_avx2(auVar19,auVar17);
  auVar39 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpmulld_avx2(auVar40,auVar23);
  auVar42 = vpaddd_avx2(auVar42,auVar25);
  auVar36 = vpmulld_avx2(auVar39,auVar20);
  auVar42 = vpaddd_avx2(auVar36,auVar42);
  auVar40 = vpmulld_avx2(auVar40,auVar20);
  auVar39 = vpmulld_avx2(auVar23,auVar39);
  auVar40 = vpaddd_avx2(auVar40,auVar25);
  auVar19 = vpsubd_avx2(auVar40,auVar39);
  auVar40 = vpmaxsd_avx2(auVar28,auVar17);
  auVar39 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpmaxsd_avx2(auVar44,auVar17);
  auVar36 = vpminsd_avx2(auVar40,auVar27);
  auVar37 = vpmulld_avx2(auVar36,auVar41);
  auVar31 = vpmulld_avx2(auVar39,auVar41);
  auVar40 = vpmulld_avx2(auVar39,auVar20);
  auVar40 = vpaddd_avx2(auVar40,auVar25);
  auVar40 = vpaddd_avx2(auVar40,auVar37);
  auVar36 = vpmulld_avx2(auVar20,auVar36);
  auVar39 = vpaddd_avx2(auVar31,auVar25);
  auVar28 = vpsubd_avx2(auVar39,auVar36);
  auVar39 = vpmaxsd_avx2(auVar33,auVar17);
  auVar36 = vpminsd_avx2(auVar39,auVar27);
  auVar39 = vpmaxsd_avx2(auVar35,auVar17);
  auVar37 = vpminsd_avx2(auVar39,auVar27);
  auVar31 = vpmulld_avx2(auVar37,auVar20);
  auVar32 = vpmulld_avx2(auVar36,auVar20);
  auVar39 = vpmulld_avx2(auVar36,auVar23);
  auVar39 = vpaddd_avx2(auVar39,auVar25);
  auVar39 = vpaddd_avx2(auVar39,auVar31);
  auVar37 = vpmulld_avx2(auVar23,auVar37);
  auVar36 = vpaddd_avx2(auVar32,auVar25);
  auVar37 = vpsubd_avx2(auVar36,auVar37);
  auVar18 = vpmaxsd_avx2(auVar17,auVar18);
  auVar36 = vpminsd_avx2(auVar18,auVar27);
  auVar18 = vpmaxsd_avx2(auVar17,auVar26);
  auVar26 = vpminsd_avx2(auVar18,auVar27);
  auVar18 = vpaddd_avx2(auVar26,auVar36);
  auVar31 = vpsubd_avx2(auVar36,auVar26);
  auVar16 = vpmaxsd_avx2(auVar17,auVar16);
  auVar26 = vpminsd_avx2(auVar16,auVar27);
  auVar16 = vpmaxsd_avx2(auVar17,auVar21);
  auVar43 = vpsrad_avx2(auVar43,auVar29);
  auVar21 = vpminsd_avx2(auVar16,auVar27);
  auVar36 = vpsrad_avx2(auVar38,auVar29);
  auVar16 = vpaddd_avx2(auVar21,auVar26);
  auVar32 = vpsubd_avx2(auVar26,auVar21);
  auVar21 = vpsrad_avx2(auVar42,auVar29);
  auVar26 = vpaddd_avx2(auVar43,auVar21);
  auVar44 = vpsubd_avx2(auVar43,auVar21);
  auVar43 = vpsrad_avx2(auVar19,auVar29);
  auVar21 = vpaddd_avx2(auVar36,auVar43);
  auVar36 = vpsubd_avx2(auVar36,auVar43);
  auVar24 = vpmaxsd_avx2(auVar17,auVar24);
  auVar43 = vpminsd_avx2(auVar24,auVar27);
  auVar24 = vpmaxsd_avx2(auVar17,auVar30);
  auVar30 = vpminsd_avx2(auVar24,auVar27);
  auVar24 = vpaddd_avx2(auVar30,auVar43);
  auVar19 = vpsubd_avx2(auVar43,auVar30);
  auVar45 = vpmaxsd_avx2(auVar17,auVar45);
  auVar30 = vpminsd_avx2(auVar45,auVar27);
  auVar45 = vpmaxsd_avx2(auVar17,auVar34);
  auVar43 = vpsrad_avx2(auVar40,auVar29);
  auVar34 = vpminsd_avx2(auVar45,auVar27);
  auVar42 = vpsrad_avx2(auVar28,auVar29);
  auVar45 = vpaddd_avx2(auVar34,auVar30);
  auVar28 = vpsubd_avx2(auVar30,auVar34);
  auVar29 = ZEXT416((uint)bit);
  auVar34 = vpsrad_avx2(auVar39,auVar29);
  auVar30 = vpaddd_avx2(auVar34,auVar43);
  auVar22 = vpsubd_avx2(auVar43,auVar34);
  auVar43 = vpsrad_avx2(auVar37,auVar29);
  auVar34 = vpaddd_avx2(auVar43,auVar42);
  auVar33 = vpsubd_avx2(auVar42,auVar43);
  auVar18 = vpmaxsd_avx2(auVar18,auVar17);
  auVar43 = vpmaxsd_avx2(auVar31,auVar17);
  auVar16 = vpmaxsd_avx2(auVar16,auVar17);
  auVar42 = vpmaxsd_avx2(auVar17,auVar32);
  auVar26 = vpmaxsd_avx2(auVar17,auVar26);
  auVar40 = vpmaxsd_avx2(auVar44,auVar17);
  auVar21 = vpmaxsd_avx2(auVar17,auVar21);
  auVar39 = vpmaxsd_avx2(auVar36,auVar17);
  auVar24 = vpmaxsd_avx2(auVar17,auVar24);
  auVar36 = vpmaxsd_avx2(auVar17,auVar19);
  auVar45 = vpmaxsd_avx2(auVar17,auVar45);
  auVar37 = vpmaxsd_avx2(auVar17,auVar28);
  auVar30 = vpmaxsd_avx2(auVar17,auVar30);
  auVar31 = vpmaxsd_avx2(auVar17,auVar22);
  auVar34 = vpmaxsd_avx2(auVar34,auVar17);
  auVar32 = vpmaxsd_avx2(auVar33,auVar17);
  alVar4 = (__m256i)vpminsd_avx2(auVar18,auVar27);
  auVar18 = vpminsd_avx2(auVar27,auVar43);
  auVar43 = vpminsd_avx2(auVar16,auVar27);
  auVar16 = vpminsd_avx2(auVar42,auVar27);
  auVar42 = vpminsd_avx2(auVar26,auVar27);
  auVar26 = vpminsd_avx2(auVar40,auVar27);
  auVar40 = vpminsd_avx2(auVar21,auVar27);
  auVar21 = vpminsd_avx2(auVar39,auVar27);
  auVar24 = vpminsd_avx2(auVar24,auVar27);
  auVar39 = vpminsd_avx2(auVar36,auVar27);
  alVar5 = (__m256i)vpminsd_avx2(auVar27,auVar45);
  auVar45 = vpminsd_avx2(auVar27,auVar37);
  in1 = (__m256i)vpminsd_avx2(auVar27,auVar30);
  auVar30 = vpminsd_avx2(auVar27,auVar31);
  auVar34 = vpminsd_avx2(auVar34,auVar27);
  auVar36 = vpminsd_avx2(auVar32,auVar27);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  auVar18 = vpmulld_avx2(auVar18,auVar28);
  auVar37 = vpmulld_avx2(auVar16,auVar28);
  auVar18 = vpaddd_avx2(auVar18,auVar25);
  auVar16 = vpaddd_avx2(auVar18,auVar37);
  auVar37 = vpsubd_avx2(auVar18,auVar37);
  auVar18 = vpmulld_avx2(auVar26,auVar28);
  auVar21 = vpmulld_avx2(auVar21,auVar28);
  auVar18 = vpaddd_avx2(auVar18,auVar25);
  auVar26 = vpaddd_avx2(auVar21,auVar18);
  auVar31 = vpsubd_avx2(auVar18,auVar21);
  auVar18 = vpmulld_avx2(auVar39,auVar28);
  auVar45 = vpmulld_avx2(auVar45,auVar28);
  auVar18 = vpaddd_avx2(auVar18,auVar25);
  auVar21 = vpaddd_avx2(auVar18,auVar45);
  auVar39 = vpsubd_avx2(auVar18,auVar45);
  auVar18 = vpmulld_avx2(auVar30,auVar28);
  auVar45 = vpmulld_avx2(auVar36,auVar28);
  auVar30 = vpsrad_avx2(auVar16,auVar29);
  alVar6 = (__m256i)vpsrad_avx2(auVar37,auVar29);
  in0 = (__m256i)vpsrad_avx2(auVar26,auVar29);
  auVar26 = vpsrad_avx2(auVar31,auVar29);
  alVar7 = (__m256i)vpsrad_avx2(auVar21,auVar29);
  auVar21 = vpsrad_avx2(auVar39,auVar29);
  auVar18 = vpaddd_avx2(auVar18,auVar25);
  auVar16 = vpaddd_avx2(auVar18,auVar45);
  auVar16 = vpsrad_avx2(auVar16,auVar29);
  auVar18 = vpsubd_avx2(auVar18,auVar45);
  alVar8 = (__m256i)vpsrad_avx2(auVar18,auVar29);
  if (do_cols == 0) {
    iVar13 = 10;
    if (10 < bd) {
      iVar13 = bd;
    }
    local_a0 = 0x20 << ((byte)iVar13 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    neg_shift_avx2(in0,in1,out,out + 1,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 2,out + 3,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 4,out + 5,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 6,out + 7,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 8,out + 9,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 10,out + 0xb,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 0xc,out + 0xd,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 0xe,out + 0xf,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
  }
  else {
    *out = alVar4;
    auVar18 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar4 = (__m256i)vpsubd_avx2(auVar18,auVar24);
    out[1] = alVar4;
    out[2][0] = in1[0];
    out[2][1] = in1[1];
    out[2][2] = in1[2];
    out[2][3] = in1[3];
    alVar4 = (__m256i)vpsubd_avx2(auVar18,auVar42);
    out[3] = alVar4;
    out[4][0] = in0[0];
    out[4][1] = in0[1];
    out[4][2] = in0[2];
    out[4][3] = in0[3];
    alVar4 = (__m256i)vpsubd_avx2(auVar18,auVar16);
    out[5] = alVar4;
    out[6] = alVar7;
    alVar4 = (__m256i)vpsubd_avx2(auVar18,auVar30);
    out[7] = alVar4;
    out[8] = alVar6;
    alVar4 = (__m256i)vpsubd_avx2(auVar18,auVar21);
    out[9] = alVar4;
    out[10] = alVar8;
    alVar4 = (__m256i)vpsubd_avx2(auVar18,auVar26);
    out[0xb] = alVar4;
    local_1a0 = auVar40._0_8_;
    lStack_198 = auVar40._8_8_;
    lStack_190 = auVar40._16_8_;
    lStack_188 = auVar40._24_8_;
    out[0xc][0] = local_1a0;
    out[0xc][1] = lStack_198;
    out[0xc][2] = lStack_190;
    out[0xc][3] = lStack_188;
    alVar4 = (__m256i)vpsubd_avx2(auVar18,auVar34);
    out[0xd] = alVar4;
    out[0xe] = alVar5;
    alVar4 = (__m256i)vpsubd_avx2(auVar18,auVar43);
    out[0xf] = alVar4;
  }
  return;
}

Assistant:

static void iadst16_low8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi18 = _mm256_set1_epi32(cospi[18]);
  const __m256i cospi46 = _mm256_set1_epi32(cospi[46]);
  const __m256i cospi26 = _mm256_set1_epi32(cospi[26]);
  const __m256i cospi38 = _mm256_set1_epi32(cospi[38]);
  const __m256i cospi34 = _mm256_set1_epi32(cospi[34]);
  const __m256i cospi30 = _mm256_set1_epi32(cospi[30]);
  const __m256i cospi42 = _mm256_set1_epi32(cospi[42]);
  const __m256i cospi22 = _mm256_set1_epi32(cospi[22]);
  const __m256i cospi50 = _mm256_set1_epi32(cospi[50]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi58 = _mm256_set1_epi32(cospi[58]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u[16], x, y;

  {
    // stage 0
    // stage 1
    // stage 2
    __m256i zero = _mm256_setzero_si256();
    x = _mm256_mullo_epi32(in[0], cospi62);
    u[0] = _mm256_add_epi32(x, rnding);
    u[0] = _mm256_srai_epi32(u[0], bit);

    x = _mm256_mullo_epi32(in[0], cospi2);
    u[1] = _mm256_sub_epi32(zero, x);
    u[1] = _mm256_add_epi32(u[1], rnding);
    u[1] = _mm256_srai_epi32(u[1], bit);

    x = _mm256_mullo_epi32(in[2], cospi54);
    u[2] = _mm256_add_epi32(x, rnding);
    u[2] = _mm256_srai_epi32(u[2], bit);

    x = _mm256_mullo_epi32(in[2], cospi10);
    u[3] = _mm256_sub_epi32(zero, x);
    u[3] = _mm256_add_epi32(u[3], rnding);
    u[3] = _mm256_srai_epi32(u[3], bit);

    x = _mm256_mullo_epi32(in[4], cospi46);
    u[4] = _mm256_add_epi32(x, rnding);
    u[4] = _mm256_srai_epi32(u[4], bit);

    x = _mm256_mullo_epi32(in[4], cospi18);
    u[5] = _mm256_sub_epi32(zero, x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    x = _mm256_mullo_epi32(in[6], cospi38);
    u[6] = _mm256_add_epi32(x, rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    x = _mm256_mullo_epi32(in[6], cospi26);
    u[7] = _mm256_sub_epi32(zero, x);
    u[7] = _mm256_add_epi32(u[7], rnding);
    u[7] = _mm256_srai_epi32(u[7], bit);

    u[8] = _mm256_mullo_epi32(in[7], cospi34);
    u[8] = _mm256_add_epi32(u[8], rnding);
    u[8] = _mm256_srai_epi32(u[8], bit);

    u[9] = _mm256_mullo_epi32(in[7], cospi30);
    u[9] = _mm256_add_epi32(u[9], rnding);
    u[9] = _mm256_srai_epi32(u[9], bit);

    u[10] = _mm256_mullo_epi32(in[5], cospi42);
    u[10] = _mm256_add_epi32(u[10], rnding);
    u[10] = _mm256_srai_epi32(u[10], bit);

    u[11] = _mm256_mullo_epi32(in[5], cospi22);
    u[11] = _mm256_add_epi32(u[11], rnding);
    u[11] = _mm256_srai_epi32(u[11], bit);

    u[12] = _mm256_mullo_epi32(in[3], cospi50);
    u[12] = _mm256_add_epi32(u[12], rnding);
    u[12] = _mm256_srai_epi32(u[12], bit);

    u[13] = _mm256_mullo_epi32(in[3], cospi14);
    u[13] = _mm256_add_epi32(u[13], rnding);
    u[13] = _mm256_srai_epi32(u[13], bit);

    u[14] = _mm256_mullo_epi32(in[1], cospi58);
    u[14] = _mm256_add_epi32(u[14], rnding);
    u[14] = _mm256_srai_epi32(u[14], bit);

    u[15] = _mm256_mullo_epi32(in[1], cospi6);
    u[15] = _mm256_add_epi32(u[15], rnding);
    u[15] = _mm256_srai_epi32(u[15], bit);

    // stage 3
    addsub_avx2(u[0], u[8], &u[0], &u[8], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[9], &u[1], &u[9], &clamp_lo, &clamp_hi);
    addsub_avx2(u[2], u[10], &u[2], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(u[3], u[11], &u[3], &u[11], &clamp_lo, &clamp_hi);
    addsub_avx2(u[4], u[12], &u[4], &u[12], &clamp_lo, &clamp_hi);
    addsub_avx2(u[5], u[13], &u[5], &u[13], &clamp_lo, &clamp_hi);
    addsub_avx2(u[6], u[14], &u[6], &u[14], &clamp_lo, &clamp_hi);
    addsub_avx2(u[7], u[15], &u[7], &u[15], &clamp_lo, &clamp_hi);

    // stage 4
    y = _mm256_mullo_epi32(u[8], cospi56);
    x = _mm256_mullo_epi32(u[9], cospi56);
    u[8] = _mm256_mullo_epi32(u[8], cospi8);
    u[8] = _mm256_add_epi32(u[8], x);
    u[8] = _mm256_add_epi32(u[8], rnding);
    u[8] = _mm256_srai_epi32(u[8], bit);

    x = _mm256_mullo_epi32(u[9], cospi8);
    u[9] = _mm256_sub_epi32(y, x);
    u[9] = _mm256_add_epi32(u[9], rnding);
    u[9] = _mm256_srai_epi32(u[9], bit);

    x = _mm256_mullo_epi32(u[11], cospi24);
    y = _mm256_mullo_epi32(u[10], cospi24);
    u[10] = _mm256_mullo_epi32(u[10], cospi40);
    u[10] = _mm256_add_epi32(u[10], x);
    u[10] = _mm256_add_epi32(u[10], rnding);
    u[10] = _mm256_srai_epi32(u[10], bit);

    x = _mm256_mullo_epi32(u[11], cospi40);
    u[11] = _mm256_sub_epi32(y, x);
    u[11] = _mm256_add_epi32(u[11], rnding);
    u[11] = _mm256_srai_epi32(u[11], bit);

    x = _mm256_mullo_epi32(u[13], cospi8);
    y = _mm256_mullo_epi32(u[12], cospi8);
    u[12] = _mm256_mullo_epi32(u[12], cospim56);
    u[12] = _mm256_add_epi32(u[12], x);
    u[12] = _mm256_add_epi32(u[12], rnding);
    u[12] = _mm256_srai_epi32(u[12], bit);

    x = _mm256_mullo_epi32(u[13], cospim56);
    u[13] = _mm256_sub_epi32(y, x);
    u[13] = _mm256_add_epi32(u[13], rnding);
    u[13] = _mm256_srai_epi32(u[13], bit);

    x = _mm256_mullo_epi32(u[15], cospi40);
    y = _mm256_mullo_epi32(u[14], cospi40);
    u[14] = _mm256_mullo_epi32(u[14], cospim24);
    u[14] = _mm256_add_epi32(u[14], x);
    u[14] = _mm256_add_epi32(u[14], rnding);
    u[14] = _mm256_srai_epi32(u[14], bit);

    x = _mm256_mullo_epi32(u[15], cospim24);
    u[15] = _mm256_sub_epi32(y, x);
    u[15] = _mm256_add_epi32(u[15], rnding);
    u[15] = _mm256_srai_epi32(u[15], bit);

    // stage 5
    addsub_avx2(u[0], u[4], &u[0], &u[4], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[5], &u[1], &u[5], &clamp_lo, &clamp_hi);
    addsub_avx2(u[2], u[6], &u[2], &u[6], &clamp_lo, &clamp_hi);
    addsub_avx2(u[3], u[7], &u[3], &u[7], &clamp_lo, &clamp_hi);
    addsub_avx2(u[8], u[12], &u[8], &u[12], &clamp_lo, &clamp_hi);
    addsub_avx2(u[9], u[13], &u[9], &u[13], &clamp_lo, &clamp_hi);
    addsub_avx2(u[10], u[14], &u[10], &u[14], &clamp_lo, &clamp_hi);
    addsub_avx2(u[11], u[15], &u[11], &u[15], &clamp_lo, &clamp_hi);

    // stage 6
    x = _mm256_mullo_epi32(u[5], cospi48);
    y = _mm256_mullo_epi32(u[4], cospi48);
    u[4] = _mm256_mullo_epi32(u[4], cospi16);
    u[4] = _mm256_add_epi32(u[4], x);
    u[4] = _mm256_add_epi32(u[4], rnding);
    u[4] = _mm256_srai_epi32(u[4], bit);

    x = _mm256_mullo_epi32(u[5], cospi16);
    u[5] = _mm256_sub_epi32(y, x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    x = _mm256_mullo_epi32(u[7], cospi16);
    y = _mm256_mullo_epi32(u[6], cospi16);
    u[6] = _mm256_mullo_epi32(u[6], cospim48);
    u[6] = _mm256_add_epi32(u[6], x);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    x = _mm256_mullo_epi32(u[7], cospim48);
    u[7] = _mm256_sub_epi32(y, x);
    u[7] = _mm256_add_epi32(u[7], rnding);
    u[7] = _mm256_srai_epi32(u[7], bit);

    x = _mm256_mullo_epi32(u[13], cospi48);
    y = _mm256_mullo_epi32(u[12], cospi48);
    u[12] = _mm256_mullo_epi32(u[12], cospi16);
    u[12] = _mm256_add_epi32(u[12], x);
    u[12] = _mm256_add_epi32(u[12], rnding);
    u[12] = _mm256_srai_epi32(u[12], bit);

    x = _mm256_mullo_epi32(u[13], cospi16);
    u[13] = _mm256_sub_epi32(y, x);
    u[13] = _mm256_add_epi32(u[13], rnding);
    u[13] = _mm256_srai_epi32(u[13], bit);

    x = _mm256_mullo_epi32(u[15], cospi16);
    y = _mm256_mullo_epi32(u[14], cospi16);
    u[14] = _mm256_mullo_epi32(u[14], cospim48);
    u[14] = _mm256_add_epi32(u[14], x);
    u[14] = _mm256_add_epi32(u[14], rnding);
    u[14] = _mm256_srai_epi32(u[14], bit);

    x = _mm256_mullo_epi32(u[15], cospim48);
    u[15] = _mm256_sub_epi32(y, x);
    u[15] = _mm256_add_epi32(u[15], rnding);
    u[15] = _mm256_srai_epi32(u[15], bit);

    // stage 7
    addsub_avx2(u[0], u[2], &u[0], &u[2], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[3], &u[1], &u[3], &clamp_lo, &clamp_hi);
    addsub_avx2(u[4], u[6], &u[4], &u[6], &clamp_lo, &clamp_hi);
    addsub_avx2(u[5], u[7], &u[5], &u[7], &clamp_lo, &clamp_hi);
    addsub_avx2(u[8], u[10], &u[8], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(u[9], u[11], &u[9], &u[11], &clamp_lo, &clamp_hi);
    addsub_avx2(u[12], u[14], &u[12], &u[14], &clamp_lo, &clamp_hi);
    addsub_avx2(u[13], u[15], &u[13], &u[15], &clamp_lo, &clamp_hi);

    // stage 8
    y = _mm256_mullo_epi32(u[2], cospi32);
    x = _mm256_mullo_epi32(u[3], cospi32);
    u[2] = _mm256_add_epi32(y, x);
    u[2] = _mm256_add_epi32(u[2], rnding);
    u[2] = _mm256_srai_epi32(u[2], bit);

    u[3] = _mm256_sub_epi32(y, x);
    u[3] = _mm256_add_epi32(u[3], rnding);
    u[3] = _mm256_srai_epi32(u[3], bit);
    y = _mm256_mullo_epi32(u[6], cospi32);
    x = _mm256_mullo_epi32(u[7], cospi32);
    u[6] = _mm256_add_epi32(y, x);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    u[7] = _mm256_sub_epi32(y, x);
    u[7] = _mm256_add_epi32(u[7], rnding);
    u[7] = _mm256_srai_epi32(u[7], bit);

    y = _mm256_mullo_epi32(u[10], cospi32);
    x = _mm256_mullo_epi32(u[11], cospi32);
    u[10] = _mm256_add_epi32(y, x);
    u[10] = _mm256_add_epi32(u[10], rnding);
    u[10] = _mm256_srai_epi32(u[10], bit);

    u[11] = _mm256_sub_epi32(y, x);
    u[11] = _mm256_add_epi32(u[11], rnding);
    u[11] = _mm256_srai_epi32(u[11], bit);

    y = _mm256_mullo_epi32(u[14], cospi32);
    x = _mm256_mullo_epi32(u[15], cospi32);
    u[14] = _mm256_add_epi32(y, x);
    u[14] = _mm256_add_epi32(u[14], rnding);
    u[14] = _mm256_srai_epi32(u[14], bit);

    u[15] = _mm256_sub_epi32(y, x);
    u[15] = _mm256_add_epi32(u[15], rnding);
    u[15] = _mm256_srai_epi32(u[15], bit);

    // stage 9
    if (do_cols) {
      out[0] = u[0];
      out[1] = _mm256_sub_epi32(_mm256_setzero_si256(), u[8]);
      out[2] = u[12];
      out[3] = _mm256_sub_epi32(_mm256_setzero_si256(), u[4]);
      out[4] = u[6];
      out[5] = _mm256_sub_epi32(_mm256_setzero_si256(), u[14]);
      out[6] = u[10];
      out[7] = _mm256_sub_epi32(_mm256_setzero_si256(), u[2]);
      out[8] = u[3];
      out[9] = _mm256_sub_epi32(_mm256_setzero_si256(), u[11]);
      out[10] = u[15];
      out[11] = _mm256_sub_epi32(_mm256_setzero_si256(), u[7]);
      out[12] = u[5];
      out[13] = _mm256_sub_epi32(_mm256_setzero_si256(), u[13]);
      out[14] = u[9];
      out[15] = _mm256_sub_epi32(_mm256_setzero_si256(), u[1]);
    } else {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m256i clamp_lo_out =
          _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      const __m256i clamp_hi_out =
          _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

      neg_shift_avx2(u[0], u[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
      neg_shift_avx2(u[12], u[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[6], u[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[10], u[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[3], u[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[15], u[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[5], u[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[9], u[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    }
  }
}